

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoad.h
# Opt level: O1

void __thiscall
chrono::ChLoad<chrono::ChLoaderXYZnode>::LoadIntLoadResidual_F
          (ChLoad<chrono::ChLoaderXYZnode> *this,ChVectorDynamic<> *R,double c)

{
  undefined1 auVar1 [16];
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  double *pdVar4;
  char cVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  long *plVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  
  iVar9 = 0;
  uVar8 = 0;
  do {
    peVar2 = (this->loader).super_ChLoaderUVWatomic.super_ChLoaderUVW.loadable.
             super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar2 == (element_type *)0x0) {
      plVar13 = (long *)0x0;
    }
    else {
      plVar13 = (long *)((long)&peVar2->field_0x0 + *(long *)((long)*peVar2 + -0x78));
    }
    p_Var3 = (this->loader).super_ChLoaderUVWatomic.super_ChLoaderUVW.loadable.
             super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      }
    }
    iVar6 = (**(code **)(*plVar13 + 0x40))();
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
    if (iVar6 <= iVar9) {
      return;
    }
    peVar2 = (this->loader).super_ChLoaderUVWatomic.super_ChLoaderUVW.loadable.
             super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar2 == (element_type *)0x0) {
      plVar13 = (long *)0x0;
    }
    else {
      plVar13 = (long *)((long)&peVar2->field_0x0 + *(long *)((long)*peVar2 + -0x78));
    }
    p_Var3 = (this->loader).super_ChLoaderUVWatomic.super_ChLoaderUVW.loadable.
             super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      }
    }
    cVar5 = (**(code **)(*plVar13 + 0x58))(plVar13,iVar9);
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
    if (cVar5 != '\0') {
      peVar2 = (this->loader).super_ChLoaderUVWatomic.super_ChLoaderUVW.loadable.
               super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar2 == (element_type *)0x0) {
        plVar13 = (long *)0x0;
      }
      else {
        plVar13 = (long *)((long)&peVar2->field_0x0 + *(long *)((long)*peVar2 + -0x78));
      }
      p_Var3 = (this->loader).super_ChLoaderUVWatomic.super_ChLoaderUVW.loadable.
               super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        }
      }
      iVar6 = (**(code **)(*plVar13 + 0x48))(plVar13,iVar9);
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
      }
      uVar12 = 0;
      while( true ) {
        peVar2 = (this->loader).super_ChLoaderUVWatomic.super_ChLoaderUVW.loadable.
                 super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (peVar2 == (element_type *)0x0) {
          plVar13 = (long *)0x0;
        }
        else {
          plVar13 = (long *)((long)&peVar2->field_0x0 + *(long *)((long)*peVar2 + -0x78));
        }
        p_Var3 = (this->loader).super_ChLoaderUVWatomic.super_ChLoaderUVW.loadable.
                 super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
        if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
          }
        }
        uVar7 = (**(code **)(*plVar13 + 0x50))(plVar13,iVar9);
        if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
        }
        if (uVar7 <= uVar12) break;
        uVar10 = uVar8 + uVar12 & 0xffffffff;
        if (*(Index *)((long)&(this->loader).super_ChLoaderUVWatomic.super_ChLoaderUVW.
                              super_ChLoader.Q.
                              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                              m_storage + 8) <= (long)uVar10) {
LAB_0064e19d:
          __assert_fail("index >= 0 && index < size()",
                        "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                        "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                       );
        }
        uVar11 = (ulong)(uint)(iVar6 + (int)uVar12);
        if ((R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows <=
            (long)uVar11) goto LAB_0064e19d;
        auVar14._8_8_ = 0;
        auVar14._0_8_ =
             (this->loader).super_ChLoaderUVWatomic.super_ChLoaderUVW.super_ChLoader.Q.
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[uVar10]
        ;
        pdVar4 = (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                 m_data;
        auVar15._8_8_ = 0;
        auVar15._0_8_ = c;
        auVar1._8_8_ = 0;
        auVar1._0_8_ = pdVar4[uVar11];
        auVar1 = vfmadd213sd_fma(auVar14,auVar15,auVar1);
        pdVar4[uVar11] = auVar1._0_8_;
        uVar12 = uVar12 + 1;
      }
      uVar8 = uVar8 + (int)uVar12;
    }
    iVar9 = iVar9 + 1;
  } while( true );
}

Assistant:

inline void ChLoad<Tloader>::LoadIntLoadResidual_F(ChVectorDynamic<>& R, double c) {
    unsigned int rowQ = 0;
    for (int i = 0; i < this->loader.GetLoadable()->GetSubBlocks(); ++i) {
        if (this->loader.GetLoadable()->IsSubBlockActive(i)) {
            unsigned int moffset = this->loader.GetLoadable()->GetSubBlockOffset(i);
            for (unsigned int row = 0; row < this->loader.GetLoadable()->GetSubBlockSize(i); ++row) {
                R(row + moffset) += this->loader.Q(rowQ) * c;
                ++rowQ;
            }
        }
    }
}